

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall spirv_cross::ParsedIR::reset_all_of_type(ParsedIR *this,Types type)

{
  uint uVar1;
  Types TVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  Variant *pVVar5;
  long lVar6;
  
  sVar3 = this->ids_for_type[type].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar3 != 0) {
    pTVar4 = this->ids_for_type[type].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
             .ptr;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar4->id + lVar6);
      pVVar5 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      TVar2 = pVVar5[uVar1].type;
      if (TVar2 == type) {
        pVVar5 = pVVar5 + uVar1;
        if (pVVar5->holder != (IVariant *)0x0) {
          (**(code **)(*(long *)pVVar5->group->pools[TVar2]._M_t.
                                super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                                ._M_t + 0x10))();
        }
        pVVar5->holder = (IVariant *)0x0;
        pVVar5->type = TypeNone;
      }
      lVar6 = lVar6 + 4;
    } while (sVar3 << 2 != lVar6);
  }
  this->ids_for_type[type].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  return;
}

Assistant:

void ParsedIR::reset_all_of_type(Types type)
{
	for (auto &id : ids_for_type[type])
		if (ids[id].get_type() == type)
			ids[id].reset();

	ids_for_type[type].clear();
}